

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O0

int lls_svd2(double *Ai,double *bi,int M,int N,double *xo)

{
  int iVar1;
  double *AB_00;
  double *q_00;
  double *B;
  double *A;
  int iVar2;
  double dVar3;
  double eps;
  double *C;
  double *V;
  double *q;
  double *AB;
  int t2;
  int t;
  int j;
  int i;
  int np;
  int mnmax;
  int P;
  int retcode;
  double *xo_local;
  int N_local;
  int M_local;
  double *bi_local;
  double *Ai_local;
  
  i = N;
  if (N < M) {
    i = M;
  }
  iVar1 = N + 1;
  dVar3 = macheps();
  AB_00 = (double *)malloc((long)i * 8 * (long)iVar1);
  q_00 = (double *)malloc((long)N << 3);
  B = (double *)malloc((long)N << 3);
  A = (double *)malloc((long)N * 8 * (long)N);
  for (t = 0; t < M; t = t + 1) {
    for (t2 = 0; t2 < N; t2 = t2 + 1) {
      AB_00[t * iVar1 + t2] = Ai[t * N + t2];
    }
  }
  for (t = 0; t < M; t = t + 1) {
    AB_00[t * iVar1 + N] = bi[t];
  }
  minfit(AB_00,M,N,1,q_00);
  for (t = 0; t < N; t = t + 1) {
    for (t2 = 0; t2 < N; t2 = t2 + 1) {
      A[t * N + t2] = AB_00[t * iVar1 + t2];
    }
  }
  for (t = 0; t < N; t = t + 1) {
    for (t2 = 0; t2 < N; t2 = t2 + 1) {
      if (ABS(q_00[t2]) <= dVar3) {
        A[t * N + t2] = 0.0;
      }
      else {
        iVar2 = t * N + t2;
        A[iVar2] = A[iVar2] / q_00[t2];
      }
    }
  }
  for (t = 0; t < N; t = t + 1) {
    B[t] = AB_00[t * iVar1 + N];
  }
  mmult(A,B,xo,N,N,1);
  free(AB_00);
  free(q_00);
  free(A);
  free(B);
  return 0;
}

Assistant:

int lls_svd2(double *Ai,double *bi,int M,int N,double *xo) {
	int retcode,P,mnmax,np,i,j,t,t2;
	double *AB,*q,*V,*C;
	double eps;

	if (M > N) {
		mnmax = M;
	} else {
		mnmax = N;
	}
	retcode = 0;
	P = 1;
	np = N + P;
	eps = macheps();

	AB = (double*) malloc(sizeof(double) * mnmax * np);
	q = (double*) malloc(sizeof(double) * N);
	C = (double*) malloc(sizeof(double) * N);
	V = (double*) malloc(sizeof(double) * N * N);

	for(i = 0; i < M;++i) {
		t = i * N;
		t2 = i * np;
		for(j = 0; j < N;++j) {
			AB[t2 + j] = Ai[t+j];
		}
	}

	for(i = 0; i < M;++i) {
		t2 = i * np;
		AB[t2+N] = bi[i];
	}

	minfit(AB,M,N,P,q);

	for(i = 0; i < N;++i) {
		t = i * N;
		t2 = i * np;
		for(j = 0; j < N;++j) {
			V[t+j] = AB[t2 + j];
		}
	}

	for(i = 0; i < N;++i) {
		t = i *N;
		for(j = 0; j < N;++j) {
			if (fabs(q[j]) > eps) {
				V[t+j] /= q[j];
			} else {
				V[t+j] = 0.0;
			}
		}
	}

	for(i = 0; i < N;++i) {
		t2 = i * np;
		C[i] = AB[t2+N];
	}
	mmult(V,C,xo,N,N,1);

	free(AB);
	free(q);
	free(V);
	free(C);
	return retcode;
}